

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav *pWav,ma_uint64 framesToRead,float *pBufferOut)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  ulong uVar6;
  uint shift;
  int iVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  uint j;
  ma_uint64 sample;
  ulong uVar15;
  ma_uint64 totalFramesRead;
  ma_uint64 mVar16;
  ma_int16 samples16 [2048];
  double local_1038 [513];
  
  if (framesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    if (pBufferOut == (float *)0x0) {
      mVar16 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
      return mVar16;
    }
    uVar1 = pWav->translatedFormatTag;
    switch(uVar1) {
    case 1:
      memset(local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar12 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar12 = (ulong)uVar3;
      }
      if ((uint)uVar12 != 0) {
        uVar1 = pWav->channels;
        uVar5 = uVar12 / uVar1;
        if ((uint)uVar12 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar12 % (ulong)uVar1) == 0) {
          uVar3 = (uint)uVar5;
          mVar16 = 0;
          do {
            if (framesToRead == 0) {
              return mVar16;
            }
            bVar2 = false;
            uVar11 = 0x1000 / uVar12;
            if (framesToRead < 0x1000 / uVar12) {
              uVar11 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar11,local_1038);
            if (mVar4 != 0) {
              uVar11 = pWav->channels * mVar4;
              if (uVar11 * uVar5 < 0x1001) {
                switch(uVar3) {
                case 1:
                  if (uVar11 != 0 && pBufferOut != (float *)0x0) {
                    lVar8 = 0;
                    do {
                      pBufferOut[lVar8] =
                           (float)*(byte *)((long)local_1038 + lVar8) * 0.007843138 + -1.0;
                      lVar8 = lVar8 + 1;
                    } while (uVar11 - lVar8 != 0);
                  }
                  break;
                case 2:
                  if (uVar11 != 0 && pBufferOut != (float *)0x0) {
                    lVar8 = 0;
                    do {
                      pBufferOut[lVar8] =
                           (float)(int)*(short *)((long)local_1038 + lVar8 * 2) * 3.0517578e-05;
                      lVar8 = lVar8 + 1;
                    } while (uVar11 - lVar8 != 0);
                  }
                  break;
                case 3:
                  ma_dr_wav_s24_to_f32(pBufferOut,(ma_uint8 *)local_1038,uVar11);
                  break;
                case 4:
                  if (uVar11 != 0 && pBufferOut != (float *)0x0) {
                    lVar8 = 0;
                    do {
                      pBufferOut[lVar8] =
                           (float)*(int *)((long)local_1038 + lVar8 * 4) * 4.656613e-10;
                      lVar8 = lVar8 + 1;
                    } while (uVar11 - lVar8 != 0);
                  }
                  break;
                default:
                  if (uVar3 < 9) {
                    if (uVar11 != 0) {
                      uVar6 = 0;
                      pdVar13 = local_1038;
                      pfVar10 = pBufferOut;
                      do {
                        lVar8 = 0;
                        uVar15 = 0;
                        uVar14 = uVar5;
                        iVar7 = uVar3 * -8 + 0x40;
                        do {
                          uVar15 = uVar15 | (ulong)*(byte *)((long)pdVar13 + lVar8) <<
                                            ((byte)iVar7 & 0x3f);
                          iVar7 = iVar7 + 8;
                          lVar8 = lVar8 + 1;
                          uVar14 = uVar14 - 1;
                        } while (uVar14 != 0);
                        pdVar13 = (double *)((long)pdVar13 + uVar5);
                        *pfVar10 = (float)((double)(long)uVar15 * 1.0842021724855044e-19);
                        pfVar10 = pfVar10 + 1;
                        uVar6 = (ulong)((int)uVar6 + 1);
                      } while (uVar6 <= uVar11 && uVar11 - uVar6 != 0);
                    }
                  }
                  else {
                    memset(pBufferOut,0,uVar11 * 4);
                  }
                }
                pBufferOut = pBufferOut + uVar11;
                framesToRead = framesToRead - mVar4;
                mVar16 = mVar16 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar16;
        }
        return 0;
      }
      break;
    case 3:
      memset(local_1038,0,0x1000);
      if (pWav->bitsPerSample == 0x20) {
        mVar16 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
        return mVar16;
      }
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar12 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar12 = (ulong)uVar3;
      }
      if ((uint)uVar12 != 0) {
        uVar1 = pWav->channels;
        uVar5 = uVar12 / uVar1;
        iVar7 = (int)uVar5;
        if ((uint)uVar12 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar12 % (ulong)uVar1) == 0) {
          mVar16 = 0;
          do {
            if (framesToRead == 0) {
              return mVar16;
            }
            uVar11 = 0x1000 / uVar12;
            if (framesToRead < 0x1000 / uVar12) {
              uVar11 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar11,local_1038);
            if ((mVar4 == 0) || (uVar11 = pWav->channels * mVar4, 0x1000 < uVar11 * uVar5)) {
              bVar2 = false;
            }
            else {
              if (iVar7 == 8) {
                if (uVar11 != 0 && pBufferOut != (float *)0x0) {
                  lVar8 = 0;
                  do {
                    pBufferOut[lVar8] = (float)local_1038[lVar8];
                    lVar8 = lVar8 + 1;
                  } while (uVar11 - lVar8 != 0);
                }
              }
              else if (iVar7 == 4) {
                if (uVar11 != 0) {
                  uVar6 = 0;
                  do {
                    pBufferOut[uVar6] = *(float *)((long)local_1038 + uVar6 * 4);
                    uVar6 = uVar6 + 1;
                  } while ((uVar6 & 0xffffffff) <= uVar11 && uVar11 - (uVar6 & 0xffffffff) != 0);
                }
              }
              else {
                memset(pBufferOut,0,uVar11 * 4);
              }
              pBufferOut = pBufferOut + uVar11;
              framesToRead = framesToRead - mVar4;
              mVar16 = mVar16 + mVar4;
              bVar2 = true;
            }
          } while (bVar2);
          return mVar16;
        }
        return 0;
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      memset(local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar12 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar12 = (ulong)uVar3;
      }
      if ((uint)uVar12 != 0) {
        uVar1 = pWav->channels;
        if ((uint)uVar12 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar12 % (ulong)uVar1) == 0) {
          mVar16 = 0;
          do {
            if (framesToRead == 0) {
              return mVar16;
            }
            bVar2 = false;
            uVar5 = 0x1000 / uVar12;
            if (framesToRead < 0x1000 / uVar12) {
              uVar5 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,local_1038);
            if (mVar4 != 0) {
              lVar8 = pWav->channels * mVar4;
              if (lVar8 * (uVar12 / uVar1) < 0x1001) {
                if (lVar8 != 0 && pBufferOut != (float *)0x0) {
                  lVar9 = 0;
                  do {
                    pBufferOut[lVar9] =
                         (float)(int)(short)g_ma_dr_wavAlawTable
                                            [*(byte *)((long)local_1038 + lVar9)] * 3.0517578e-05;
                    lVar9 = lVar9 + 1;
                  } while (lVar8 - lVar9 != 0);
                }
                pBufferOut = pBufferOut + lVar8;
                framesToRead = framesToRead - mVar4;
                mVar16 = mVar16 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar16;
        }
        return 0;
      }
      break;
    case 7:
      memset(local_1038,0,0x1000);
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar3 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar12 = 0, uVar3 == (pWav->fmt).channels)) {
        uVar12 = (ulong)uVar3;
      }
      if ((uint)uVar12 != 0) {
        uVar1 = pWav->channels;
        if ((uint)uVar12 < (uint)uVar1) {
          return 0;
        }
        if ((int)(uVar12 % (ulong)uVar1) == 0) {
          mVar16 = 0;
          do {
            if (framesToRead == 0) {
              return mVar16;
            }
            bVar2 = false;
            uVar5 = 0x1000 / uVar12;
            if (framesToRead < 0x1000 / uVar12) {
              uVar5 = framesToRead;
            }
            mVar4 = ma_dr_wav_read_pcm_frames(pWav,uVar5,local_1038);
            if (mVar4 != 0) {
              lVar8 = pWav->channels * mVar4;
              if (lVar8 * (uVar12 / uVar1) < 0x1001) {
                if (lVar8 != 0 && pBufferOut != (float *)0x0) {
                  lVar9 = 0;
                  do {
                    pBufferOut[lVar9] =
                         (float)(int)(short)g_ma_dr_wavMulawTable
                                            [*(byte *)((long)local_1038 + lVar9)] * 3.0517578e-05;
                    lVar9 = lVar9 + 1;
                  } while (lVar8 - lVar9 != 0);
                }
                pBufferOut = pBufferOut + lVar8;
                framesToRead = framesToRead - mVar4;
                mVar16 = mVar16 + mVar4;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
            }
          } while (bVar2);
          return mVar16;
        }
        return 0;
      }
      break;
    default:
      if (uVar1 != 0x11) {
        return 0;
      }
    case 2:
      mVar16 = 0;
      do {
        if (framesToRead == 0) {
          return mVar16;
        }
        uVar12 = (ulong)(0x800 / pWav->channels);
        if (framesToRead < uVar12) {
          uVar12 = framesToRead;
        }
        mVar4 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar12,(ma_int16 *)local_1038);
        if (mVar4 != 0) {
          lVar8 = pWav->channels * mVar4;
          if (lVar8 != 0 && pBufferOut != (float *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] =
                   (float)(int)*(short *)((long)local_1038 + lVar9 * 2) * 3.0517578e-05;
              lVar9 = lVar9 + 1;
            } while (lVar8 - lVar9 != 0);
          }
          pBufferOut = pBufferOut + lVar8;
          framesToRead = framesToRead - mVar4;
          mVar16 = mVar16 + mVar4;
        }
      } while (mVar4 != 0);
      return mVar16;
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_f32(ma_dr_wav* pWav, ma_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(float) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(float) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_f32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}